

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

QByteArrayList * QDecompressHelper::acceptedEncoding(void)

{
  long lVar1;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  ContentEncodingMapping *mapping;
  ContentEncodingMapping *__end1;
  ContentEncodingMapping *__begin1;
  ContentEncodingMapping (*__range1) [4];
  QByteArrayList *list;
  rvalue_ref in_stack_ffffffffffffff98;
  _Multi_array<std::__detail::__variant::__deduce_visit_result<QMimeType>_(*)((lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_access_qformdatabuilder_cpp:316:44)_&&,_std::variant<QIODevice_*,_QByteArray>_&)>
  *local_40;
  QList<QByteArray> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->m_size = -0x5555555555555556;
  in_RDI->m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = -0x5555555555555556;
  QList<QByteArray>::QList((QList<QByteArray> *)0x2a88f2);
  std::size<(anonymous_namespace)::ContentEncodingMapping,4ul>
            ((ContentEncodingMapping (*) [4])&(anonymous_namespace)::contentEncodingMapping);
  QList<QByteArray>::reserve(in_stack_ffffffffffffffc8,in_stack_00000008);
  for (local_40 = (_Multi_array<std::__detail::__variant::__deduce_visit_result<QMimeType>_(*)((lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_access_qformdatabuilder_cpp:316:44)_&&,_std::variant<QIODevice_*,_QByteArray>_&)>
                   *)&(anonymous_namespace)::contentEncodingMapping;
      (_Array_type *)local_40 !=
      &std::__detail::__variant::
       __gen_vtable<std::__detail::__variant::__deduce_visit_result<QMimeType>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qformdatabuilder.cpp:316:44)_&&,_std::variant<QIODevice_*,_QByteArray>_&>
       ::_S_vtable; local_40 = local_40 + 3) {
    QByteArrayView::toByteArray(in_RDI);
    QList<QByteArray>::operator<<((QList<QByteArray> *)in_RDI,in_stack_ffffffffffffff98);
    QByteArray::~QByteArray((QByteArray *)0x2a8980);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QByteArrayList *)in_RDI;
}

Assistant:

QByteArrayList QDecompressHelper::acceptedEncoding()
{
    QByteArrayList list;
    list.reserve(std::size(contentEncodingMapping));
    for (const auto &mapping : contentEncodingMapping) {
        list << mapping.name.toByteArray();
    }
    return list;
}